

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_events_checker.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::eventsChecker::ZEeventsChecker::zeCommandListAppendBarrierPrologue
          (ZEeventsChecker *this,ze_command_list_handle_t hCommandList,
          ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"zeCommandListAppendBarrier","");
  checkForDeadlock(this,&local_50,hSignalEvent,numWaitEvents,phWaitEvents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
eventsChecker::ZEeventsChecker::zeCommandListAppendBarrierPrologue(
    ze_command_list_handle_t hCommandList, ///< [in] handle of the command list
    ze_event_handle_t hSignalEvent,        ///< [in][optional] handle of the event to signal on completion
    uint32_t numWaitEvents,                ///< [in][optional] number of events to wait on before executing barrier;
                                           ///< must be 0 if `nullptr == phWaitEvents`
    ze_event_handle_t *phWaitEvents        ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                           ///< on before executing barrier
) {
    checkForDeadlock("zeCommandListAppendBarrier", hSignalEvent, numWaitEvents, phWaitEvents);
    return ZE_RESULT_SUCCESS;
}